

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_FormatISO8601Date::test_method(util_FormatISO8601Date *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  const_string *in_stack_fffffffffffffd80;
  const_string *msg;
  size_t in_stack_fffffffffffffd88;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffd90;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffd98;
  unit_test_log_t *this_00;
  int64_t in_stack_fffffffffffffdb8;
  char *nTime;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  const_string local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [64];
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  undefined1 local_d8 [16];
  undefined1 local_c8 [64];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    FormatISO8601Date_abi_cxx11_(in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffd68 = "\"32767-12-31\"";
    in_stack_fffffffffffffd60 = "32767-12-31";
    in_stack_fffffffffffffd58 = "FormatISO8601Date(971890963199)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_c8,local_d8,0x150,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    FormatISO8601Date_abi_cxx11_(in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffd68 = "\"32767-12-31\"";
    in_stack_fffffffffffffd60 = "32767-12-31";
    in_stack_fffffffffffffd58 = "FormatISO8601Date(971890876800)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_118,local_128,0x151,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    nTime = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    FormatISO8601Date_abi_cxx11_((int64_t)nTime);
    in_stack_fffffffffffffd68 = "\"2011-09-30\"";
    in_stack_fffffffffffffd60 = "2011-09-30";
    in_stack_fffffffffffffd58 = "FormatISO8601Date(1317425777)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_168,local_178,0x152,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    msg = &local_188;
    this_00 = (unit_test_log_t *)0x63;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    line_num = local_198;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    FormatISO8601Date_abi_cxx11_((int64_t)nTime);
    in_stack_fffffffffffffd68 = "\"1970-01-01\"";
    in_stack_fffffffffffffd60 = "1970-01-01";
    in_stack_fffffffffffffd58 = "FormatISO8601Date(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1b8,local_1c8,0x153,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_FormatISO8601Date)
{
    BOOST_CHECK_EQUAL(FormatISO8601Date(971890963199), "32767-12-31");
    BOOST_CHECK_EQUAL(FormatISO8601Date(971890876800), "32767-12-31");
    BOOST_CHECK_EQUAL(FormatISO8601Date(1317425777), "2011-09-30");
    BOOST_CHECK_EQUAL(FormatISO8601Date(0), "1970-01-01");
}